

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libauthretry.c
# Opt level: O0

CURLcode send_request(CURL *curl,char *url,int seq,long auth_scheme,char *userpwd)

{
  size_t sVar1;
  void *__ptr;
  char *full_url;
  size_t len;
  CURLcode res;
  char *userpwd_local;
  long auth_scheme_local;
  int seq_local;
  char *url_local;
  CURL *curl_local;
  
  sVar1 = strlen(url);
  __ptr = malloc(sVar1 + 5);
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    curl_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    curl_msnprintf(__ptr,sVar1 + 5,"%s%04d",url,seq);
    curl_mfprintf(_stderr,"Sending new request %d to %s with credential %s (auth %ld)\n",seq,__ptr,
                  userpwd,auth_scheme);
    len._4_4_ = curl_easy_setopt(curl,0x2712,__ptr);
    if ((((len._4_4_ == CURLE_OK) &&
         (len._4_4_ = curl_easy_setopt(curl,0x29,1), len._4_4_ == CURLE_OK)) &&
        (len._4_4_ = curl_easy_setopt(curl,0x2a,1), len._4_4_ == CURLE_OK)) &&
       (((len._4_4_ = curl_easy_setopt(curl,0x50,1), len._4_4_ == CURLE_OK &&
         (len._4_4_ = curl_easy_setopt(curl,0x2715,userpwd), len._4_4_ == CURLE_OK)) &&
        (len._4_4_ = curl_easy_setopt(curl,0x6b,auth_scheme), len._4_4_ == CURLE_OK)))) {
      len._4_4_ = curl_easy_perform(curl);
    }
    free(__ptr);
    curl_local._4_4_ = len._4_4_;
  }
  return curl_local._4_4_;
}

Assistant:

static CURLcode send_request(CURL *curl, const char *url, int seq,
                             long auth_scheme, const char *userpwd)
{
  CURLcode res;
  size_t len = strlen(url) + 4 + 1;
  char* full_url = malloc(len);
  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return CURLE_OUT_OF_MEMORY;
  }

  snprintf(full_url, len, "%s%04d", url, seq);
  fprintf(stderr, "Sending new request %d to %s with credential %s "
          "(auth %ld)\n", seq, full_url, userpwd, auth_scheme);
  test_setopt(curl, CURLOPT_URL, full_url);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_HTTPGET, 1L);
  test_setopt(curl, CURLOPT_USERPWD, userpwd);
  test_setopt(curl, CURLOPT_HTTPAUTH, auth_scheme);

  res = curl_easy_perform(curl);

test_cleanup:
  free(full_url);
  return res;
}